

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_8b1c::ARTKeyEncodeDecodeTest_DoubleC0007Order_Test::
~ARTKeyEncodeDecodeTest_DoubleC0007Order_Test(ARTKeyEncodeDecodeTest_DoubleC0007Order_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TEST(ARTKeyEncodeDecodeTest, DoubleC0007Order) {
  using F = double;
  constexpr auto pzero = 0.;
  constexpr auto nzero = -0.;
  UNODB_EXPECT_FALSE(std::signbit(pzero));
  UNODB_EXPECT_TRUE(std::signbit(nzero));
  constexpr auto minf = std::numeric_limits<F>::min();
  constexpr auto maxf = std::numeric_limits<F>::max();
  constexpr auto inf = std::numeric_limits<F>::infinity();
  constexpr auto ninf = -std::numeric_limits<F>::infinity();
  constexpr auto lowest = std::numeric_limits<F>::lowest();
  do_encode_decode_lt_test(-10.01, -1.01);
  do_encode_decode_lt_test(-1., pzero);
  do_encode_decode_lt_test(nzero, pzero);
  do_encode_decode_lt_test(pzero, 1.0);
  do_encode_decode_lt_test(1.01, 10.01);
  do_encode_decode_lt_test(ninf, lowest);
  do_encode_decode_lt_test(0., minf);
  do_encode_decode_lt_test(maxf, inf);
}